

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<ConjRule_*>::push(vec<ConjRule_*> *this,ConjRule **elem)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  uint *in_RDI;
  uint local_1c;
  
  if (*in_RDI == in_RDI[1]) {
    if (in_RDI[1] < 2) {
      local_1c = 2;
    }
    else {
      local_1c = in_RDI[1] * 3 + 1 >> 1;
    }
    in_RDI[1] = local_1c;
    pvVar2 = realloc(*(void **)(in_RDI + 2),(ulong)in_RDI[1] << 3);
    *(void **)(in_RDI + 2) = pvVar2;
  }
  uVar1 = *in_RDI;
  *in_RDI = uVar1 + 1;
  *(undefined8 *)(*(long *)(in_RDI + 2) + (ulong)uVar1 * 8) = *in_RSI;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}